

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instantiation.cpp
# Opt level: O1

Clause * __thiscall
Inferences::Instantiation::ResultFn::operator()(ResultFn *this,Substitution *sub)

{
  uint uVar1;
  Self this_00;
  Literal **ppLVar2;
  Literal *pLVar3;
  Literal **ppLVar4;
  Clause *pCVar5;
  Literal **ppLVar6;
  uint uVar7;
  ulong uVar8;
  RStack<Literal_*> resLits;
  Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> local_88;
  ResultFn *local_78;
  GeneratingInference1 local_70;
  Inference local_60;
  
  ::Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  Recycled(&local_88);
  pCVar5 = this->_cl;
  uVar7 = *(uint *)&pCVar5->field_0x38 & 0xfffff;
  local_78 = this;
  if (uVar7 != 0) {
    uVar8 = (ulong)(uVar7 != 0);
    ppLVar2 = pCVar5->_literals;
    ppLVar4 = pCVar5->_literals + uVar8;
    do {
      this_00._M_t.
      super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
      .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
           local_88._self._M_t.
           super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
           .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl;
      pLVar3 = Kernel::SubstHelper::apply<Kernel::Substitution>(*ppLVar2,sub);
      if (*(Literal ***)
           ((long)this_00._M_t.
                  super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                  .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl + 0x10
           ) == *(Literal ***)
                 ((long)this_00._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl
                 + 0x18)) {
        ::Lib::Stack<Kernel::Literal_*>::expand
                  ((Stack<Kernel::Literal_*> *)
                   this_00._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl);
      }
      **(Literal ***)
        ((long)this_00._M_t.
               super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
               .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl + 0x10) =
           pLVar3;
      *(Literal ***)
       ((long)this_00._M_t.
              super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
              .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl + 0x10) =
           *(Literal ***)
            ((long)this_00._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl +
            0x10) + 1;
      uVar1 = (uint)uVar8;
      ppLVar6 = ppLVar4 + 1;
      if (uVar7 <= uVar1) {
        ppLVar4 = (Literal **)0x0;
      }
      uVar8 = (ulong)(uVar1 + 1);
      ppLVar2 = ppLVar4;
      ppLVar4 = ppLVar6;
    } while (uVar1 < uVar7);
  }
  local_70.premise = local_78->_cl;
  local_70.rule = INSTANTIATION;
  Kernel::Inference::Inference(&local_60,&local_70);
  pCVar5 = Kernel::Clause::fromStack
                     ((Stack<Kernel::Literal_*> *)
                      local_88._self._M_t.
                      super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                      .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl,
                      &local_60);
  ::Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  ~Recycled(&local_88);
  return pCVar5;
}

Assistant:

Clause* operator()(Substitution sub)
  {
    RStack<Literal*> resLits;
    for(Literal* curr : _cl->iterLits()){
      resLits->push(SubstHelper::apply(curr,sub));
    }

    return Clause::fromStack(*resLits,GeneratingInference1(InferenceRule::INSTANTIATION,_cl));
  }